

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O3

void __thiscall
Diligent::GLContextState::SetPipeline(GLContextState *this,GLPipelineObj *GLPipeline)

{
  GLuint GVar1;
  int iVar2;
  GLenum err;
  string msg;
  uint local_3c;
  string local_38;
  
  GVar1 = GLPipeline->m_uiHandle;
  if (GVar1 == 0) {
    iVar2 = 0;
  }
  else {
    iVar2 = (GLPipeline->m_UniqueId).m_ID;
    if (iVar2 == 0) {
      LOCK();
      UNLOCK();
      iVar2 = UniqueIdHelper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>::GetID()::
              GlobalCounter + 1;
      UniqueIdHelper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>::GetID()::GlobalCounter =
           UniqueIdHelper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>::GetID()::
           GlobalCounter + 1;
      (GLPipeline->m_UniqueId).m_ID = iVar2;
    }
  }
  if (this->m_GLPipelineId != iVar2) {
    this->m_GLPipelineId = iVar2;
    if ((this->m_Caps).IsProgramPipelineSupported == true) {
      (*__glewBindProgramPipeline)(GVar1);
      local_3c = glGetError();
      if (local_3c == 0) {
        return;
      }
      LogError<false,char[32],char[17],unsigned_int>
                (false,"SetPipeline",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0xa1,(char (*) [32])"Failed to bind program pipeline",
                 (char (*) [17])"\nGL Error Code: ",&local_3c);
      FormatString<char[6]>(&local_38,(char (*) [6])0x8506c9);
      DebugAssertionFailed
                (local_38._M_dataplus._M_p,"SetPipeline",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0xa1);
    }
    else {
      FormatString<char[29]>(&local_38,(char (*) [29])"SetPipeline is not supported");
      DebugAssertionFailed
                (local_38._M_dataplus._M_p,"SetPipeline",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0xa5);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void GLContextState::SetPipeline(const GLPipelineObj& GLPipeline)
{
    GLuint GLPipelineHandle = 0;
    if (UpdateBoundObject(m_GLPipelineId, GLPipeline, GLPipelineHandle))
    {
        if (m_Caps.IsProgramPipelineSupported)
        {
            glBindProgramPipeline(GLPipelineHandle);
            DEV_CHECK_GL_ERROR("Failed to bind program pipeline");
        }
        else
        {
            UNSUPPORTED("SetPipeline is not supported");
        }
    }
}